

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar7;
  FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar8;
  Fad<double> *pFVar9;
  double *pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  pFVar7 = this->left_;
  pFVar8 = (pFVar7->fadexpr_).right_;
  pFVar9 = (pFVar8->fadexpr_).expr_.fadexpr_.right_;
  pdVar10 = &pFVar9->defaultVal;
  if ((pFVar9->dx_).num_elts != 0) {
    pdVar10 = (pFVar9->dx_).ptr_to_data + i;
  }
  dVar1 = (pFVar8->fadexpr_).expr_.fadexpr_.left_.constant_;
  dVar2 = *pdVar10;
  dVar11 = exp(dVar1 * pFVar9->val_);
  dVar3 = (pFVar7->fadexpr_).left_.constant_;
  dVar12 = sin((this->right_->fadexpr_).expr_.fadexpr_.left_.constant_ *
               ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar9 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  pdVar10 = &pFVar9->defaultVal;
  if ((pFVar9->dx_).num_elts != 0) {
    pdVar10 = (pFVar9->dx_).ptr_to_data + i;
  }
  dVar4 = (this->right_->fadexpr_).expr_.fadexpr_.left_.constant_;
  dVar5 = *pdVar10;
  dVar13 = cos(dVar4 * pFVar9->val_);
  dVar6 = (this->left_->fadexpr_).left_.constant_;
  pFVar8 = (this->left_->fadexpr_).right_;
  dVar14 = exp((pFVar8->fadexpr_).expr_.fadexpr_.left_.constant_ *
               ((pFVar8->fadexpr_).expr_.fadexpr_.right_)->val_);
  return dVar14 * dVar6 * dVar13 * dVar5 * dVar4 + dVar12 * dVar11 * dVar2 * dVar1 * dVar3;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}